

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

SVInt __thiscall slang::SVInt::operator/(SVInt *this,SVInt *rhs)

{
  uint uVar1;
  uint uVar2;
  logic_t lVar3;
  bool bVar4;
  bool bVar5;
  SVInt *in_RDX;
  undefined8 uVar6;
  undefined8 extraout_RDX;
  SVInt *this_00;
  bool isSigned;
  SVInt SVar7;
  SVInt local_58;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_48;
  SVInt local_40;
  
  isSigned = (bool)((in_RDX->super_SVIntStorage).signFlag & (rhs->super_SVIntStorage).signFlag);
  uVar1 = (rhs->super_SVIntStorage).bitWidth;
  uVar2 = (in_RDX->super_SVIntStorage).bitWidth;
  if (uVar1 == uVar2) {
    bVar4 = (rhs->super_SVIntStorage).unknownFlag;
    bVar5 = (in_RDX->super_SVIntStorage).unknownFlag;
    local_48 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)this;
    SVInt<int>(&local_58,0);
    lVar3 = operator==(in_RDX,&local_58);
    ~SVInt(&local_58);
    this = (SVInt *)local_48;
    if (((bVar4 != false) || ((bVar5 & 1U) != 0)) ||
       ((lVar3.value != '\0' && ((lVar3.value != '@' && (lVar3.value != 0x80)))))) {
      SVar7 = createFillX((SVInt *)local_48.pVal,(rhs->super_SVIntStorage).bitWidth,isSigned);
      uVar6 = SVar7.super_SVIntStorage._8_8_;
      goto LAB_0025790c;
    }
    if (isSigned == false) {
LAB_00257959:
      this = (SVInt *)local_48;
      SVar7 = udiv((SVInt *)local_48.pVal,rhs,in_RDX,isSigned);
      uVar6 = SVar7.super_SVIntStorage._8_8_;
      goto LAB_0025790c;
    }
    bVar4 = isNegative(rhs);
    bVar5 = isNegative(in_RDX);
    if (bVar4) {
      if (bVar5) {
        operator-(&local_58);
        operator-(&local_40);
        this = (SVInt *)local_48;
        udiv((SVInt *)local_48.pVal,&local_58,&local_40,true);
        ~SVInt(&local_40);
        goto LAB_00257902;
      }
      operator-(&local_40);
      udiv(&local_58,&local_40,in_RDX,true);
      this = (SVInt *)local_48;
      operator-((SVInt *)local_48.pVal);
    }
    else {
      if (!bVar5) goto LAB_00257959;
      operator-(&local_40);
      udiv(&local_58,rhs,&local_40,true);
      this = (SVInt *)local_48;
      operator-((SVInt *)local_48.pVal);
    }
    ~SVInt(&local_58);
    this_00 = &local_40;
  }
  else {
    if (uVar1 < uVar2) {
      extend(&local_58,(bitwidth_t)rhs,SUB41(uVar2,0));
      operator/(this,&local_58);
    }
    else {
      extend(&local_58,(bitwidth_t)in_RDX,SUB41(uVar1,0));
      operator/(this,rhs);
    }
LAB_00257902:
    this_00 = &local_58;
  }
  ~SVInt(this_00);
  uVar6 = extraout_RDX;
LAB_0025790c:
  SVar7.super_SVIntStorage.bitWidth = (int)uVar6;
  SVar7.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar6 >> 0x20);
  SVar7.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar6 >> 0x28);
  SVar7.super_SVIntStorage._14_2_ = (short)((ulong)uVar6 >> 0x30);
  SVar7.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
  return (SVInt)SVar7.super_SVIntStorage;
}

Assistant:

SVInt SVInt::operator/(const SVInt& rhs) const {
    bool bothSigned = signFlag && rhs.signFlag;
    if (bitWidth != rhs.bitWidth) {
        if (bitWidth < rhs.bitWidth)
            return extend(rhs.bitWidth, bothSigned) / rhs;
        else
            return *this / rhs.extend(bitWidth, bothSigned);
    }

    // Any X's mean all X's; also dividing by zero does the same
    if (unknownFlag || rhs.unknownFlag || rhs == 0)
        return createFillX(bitWidth, bothSigned);

    // handle signed division
    if (bothSigned) {
        // do the division on positive numbers and flip the sign at the end
        if (isNegative()) {
            if (rhs.isNegative())
                return udiv(-(*this), -rhs, true);
            return -udiv(-(*this), rhs, true);
        }
        if (rhs.isNegative())
            return -udiv(*this, -rhs, true);
    }

    // otherwise, just do the division
    return udiv(*this, rhs, bothSigned);
}